

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O2

PVG_FT_Error PVG_FT_Stroker_ConicTo(PVG_FT_Stroker stroker,PVG_FT_Vector *control,PVG_FT_Vector *to)

{
  PVG_FT_Vector *pPVar1;
  PVG_FT_StrokeBorder border;
  long *plVar2;
  PVG_FT_Pos PVar3;
  bool bVar4;
  PVG_FT_Angle angle2;
  ulong uVar5;
  ulong uVar6;
  PVG_FT_Angle PVar7;
  PVG_FT_Fixed PVar8;
  PVG_FT_Long PVar9;
  PVG_FT_Angle angle;
  PVG_FT_Angle PVar10;
  PVG_FT_Fixed PVar11;
  PVG_FT_Long length;
  long lVar12;
  long lVar13;
  PVG_FT_Angle PVar14;
  long lVar15;
  long dx;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long dy;
  long lVar19;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  PVG_FT_Vector end;
  PVG_FT_Angle local_2b0;
  PVG_FT_Vector start;
  PVG_FT_Vector local_288;
  PVG_FT_Vector local_278;
  PVG_FT_Vector local_268;
  PVG_FT_Vector bez_stack [34];
  
  pPVar1 = &stroker->center;
  if ((((((stroker->center).x - control->x) + 1U < 3) &&
       (((stroker->center).y - control->y) + 1U < 3)) && ((control->x - to->x) + 1U < 3)) &&
     ((control->y - to->y) + 1U < 3)) {
    PVar3 = to->y;
    pPVar1->x = to->x;
    (stroker->center).y = PVar3;
    return 0;
  }
  bez_stack[0].x = to->x;
  bez_stack[0].y = to->y;
  bez_stack[1].x = control->x;
  bez_stack[1].y = control->y;
  bez_stack[2].x = pPVar1->x;
  bez_stack[2].y = (stroker->center).y;
  bVar4 = false;
  uVar20 = 0;
  do {
    uVar20 = uVar20 - 0x20;
    while( true ) {
      uVar16 = uVar20 + 0x20;
      if ((long)uVar16 < 0) {
        PVar3 = to->y;
        pPVar1->x = to->x;
        (stroker->center).y = PVar3;
        stroker->line_length = 0;
        return 0;
      }
      angle2 = stroker->angle_in;
      PVar14 = angle2;
      if (0x1df < uVar16) break;
      lVar18 = *(long *)((long)&bez_stack[3].x + uVar20);
      lVar12 = *(long *)((long)&bez_stack[4].x + uVar20);
      lVar19 = *(long *)((long)&bez_stack[3].y + uVar20);
      lVar15 = *(long *)((long)&bez_stack[4].y + uVar20);
      lVar17 = *(long *)((long)&bez_stack[2].x + uVar20);
      lVar13 = *(long *)((long)&bez_stack[2].y + uVar20);
      dx = lVar17 - lVar18;
      dy = lVar13 - lVar19;
      bVar21 = 2 < dx + 1U;
      bVar22 = 2 < dy + 1U;
      if (((lVar18 - lVar12) + 1U < 3) && ((lVar19 - lVar15) + 1U < 3)) {
        if (bVar22 || bVar21) {
          angle2 = PVG_FT_Atan2(dx,dy);
          PVar14 = angle2;
        }
      }
      else {
        PVar14 = PVG_FT_Atan2(lVar18 - lVar12,lVar19 - lVar15);
        angle2 = PVar14;
        if (bVar22 || bVar21) {
          angle2 = PVG_FT_Atan2(dx,dy);
        }
      }
      uVar5 = PVG_FT_Angle_Diff(PVar14,angle2);
      uVar6 = -uVar5;
      if (0 < (long)uVar5) {
        uVar6 = uVar5;
      }
      if (uVar6 < 0x1e0000) break;
      if (stroker->first_point != '\0') {
        stroker->angle_in = PVar14;
      }
      *(long *)((long)&bez_stack[6].x + uVar20) = lVar12;
      lVar17 = lVar17 + lVar18;
      *(long *)((long)&bez_stack[5].x + uVar20) = lVar12 + lVar18 >> 1;
      *(long *)((long)&bez_stack[4].x + uVar20) = lVar12 + lVar18 + lVar17 >> 2;
      *(long *)((long)&bez_stack[3].x + uVar20) = lVar17 >> 1;
      *(long *)((long)&bez_stack[6].y + uVar20) = lVar15;
      lVar13 = lVar13 + lVar19;
      *(long *)((long)&bez_stack[5].y + uVar20) = lVar15 + lVar19 >> 1;
      *(long *)((long)&bez_stack[4].y + uVar20) = lVar13 + lVar15 + lVar19 >> 2;
      *(long *)((long)&bez_stack[3].y + uVar20) = lVar13 >> 1;
      uVar20 = uVar16;
    }
    if (bVar4) {
      uVar6 = PVG_FT_Angle_Diff(stroker->angle_in,PVar14);
      uVar16 = -uVar6;
      if (0 < (long)uVar6) {
        uVar16 = uVar6;
      }
      if (0x78000 < uVar16) {
        PVar3 = *(PVG_FT_Pos *)((long)&bez_stack[4].y + uVar20);
        pPVar1->x = *(PVG_FT_Pos *)((long)&bez_stack[4].x + uVar20);
        (stroker->center).y = PVar3;
        stroker->angle_out = PVar14;
        stroker->line_join = PVG_FT_STROKER_LINEJOIN_ROUND;
        ft_stroker_process_corner(stroker,0);
        stroker->line_join = stroker->line_join_saved;
      }
    }
    else if (stroker->first_point == '\0') {
      stroker->angle_out = PVar14;
      ft_stroker_process_corner(stroker,0);
    }
    else {
      ft_stroker_subpath_start(stroker,PVar14,0);
    }
    PVar7 = PVG_FT_Angle_Diff(PVar14,angle2);
    PVar9 = stroker->radius;
    PVar8 = PVG_FT_Cos(PVar7 / 2);
    PVar9 = PVG_FT_DivFix(PVar9,PVar8);
    if (stroker->handle_wide_strokes == '\0') {
      local_2b0 = 0;
    }
    else {
      local_2b0 = PVG_FT_Atan2(*(long *)((long)&bez_stack[2].x + uVar20) -
                               *(long *)((long)&bez_stack[4].x + uVar20),
                               *(long *)((long)&bez_stack[2].y + uVar20) -
                               *(long *)((long)&bez_stack[4].y + uVar20));
    }
    lVar12 = angle2 + 0x5a0000;
    PVar14 = PVar14 + PVar7 / 2 + 0x5a0000;
    for (lVar18 = 0x70; lVar18 != 0xc0; lVar18 = lVar18 + 0x28) {
      border = (PVG_FT_StrokeBorder)((long)stroker->borders + lVar18 + -0x70);
      PVG_FT_Vector_From_Polar(&local_288,PVar9,PVar14);
      local_288.x = *(long *)((long)&bez_stack[3].x + uVar20) + local_288.x;
      local_288.y = *(long *)((long)&bez_stack[3].y + uVar20) + local_288.y;
      PVG_FT_Vector_From_Polar(&end,stroker->radius,lVar12);
      lVar19 = *(long *)((long)&bez_stack[2].x + uVar20);
      lVar15 = *(long *)((long)&bez_stack[2].y + uVar20);
      end.x = end.x + lVar19;
      end.y = end.y + lVar15;
      if (stroker->handle_wide_strokes == '\0') {
LAB_0011822b:
        ft_stroke_border_conicto(border,&local_288,&end);
      }
      else {
        plVar2 = (long *)(*(long *)((long)stroker->borders + lVar18 + -0x68) +
                         (ulong)(*(int *)((long)stroker->borders + lVar18 + -0x70) - 1) * 0x10);
        lVar17 = *plVar2;
        lVar13 = plVar2[1];
        start.x = lVar17;
        start.y = lVar13;
        PVar7 = PVG_FT_Atan2(end.x - lVar17,end.y - lVar13);
        uVar6 = PVG_FT_Angle_Diff(local_2b0,PVar7);
        uVar16 = -uVar6;
        if (0 < (long)uVar6) {
          uVar16 = uVar6;
        }
        if (uVar16 < 0x5a0001) goto LAB_0011822b;
        angle = PVG_FT_Atan2(*(long *)((long)&bez_stack[4].x + uVar20) - lVar17,
                             *(long *)((long)&bez_stack[4].y + uVar20) - lVar13);
        PVar10 = PVG_FT_Atan2(lVar19 - end.x,lVar15 - end.y);
        local_268.x = end.x - lVar17;
        local_268.y = end.y - lVar13;
        PVar8 = PVG_FT_Vector_Length(&local_268);
        PVar11 = PVG_FT_Sin(PVar7 - PVar10);
        lVar19 = -PVar11;
        if (0 < PVar11) {
          lVar19 = PVar11;
        }
        PVar11 = PVG_FT_Sin(angle - PVar10);
        lVar15 = -PVar11;
        if (0 < PVar11) {
          lVar15 = PVar11;
        }
        length = PVG_FT_MulDiv(PVar8,lVar19,lVar15);
        PVG_FT_Vector_From_Polar(&local_278,length,angle);
        local_278.x = lVar17 + local_278.x;
        local_278.y = lVar13 + local_278.y;
        *(undefined1 *)((long)stroker->borders + lVar18 + -0x58) = 0;
        ft_stroke_border_lineto(border,&local_278,'\0');
        ft_stroke_border_lineto(border,&end,'\0');
        ft_stroke_border_conicto(border,&local_288,&start);
        ft_stroke_border_lineto(border,&end,'\0');
      }
      lVar12 = lVar12 + -0xb40000;
      PVar14 = PVar14 + -0xb40000;
    }
    stroker->angle_in = angle2;
    bVar4 = true;
  } while( true );
}

Assistant:

PVG_FT_Error PVG_FT_Stroker_ConicTo(PVG_FT_Stroker stroker, PVG_FT_Vector* control,
                                  PVG_FT_Vector* to)
{
    PVG_FT_Error   error = 0;
    PVG_FT_Vector  bez_stack[34];
    PVG_FT_Vector* arc;
    PVG_FT_Vector* limit = bez_stack + 30;
    PVG_FT_Bool    first_arc = TRUE;

    /* if all control points are coincident, this is a no-op; */
    /* avoid creating a spurious corner                       */
    if (PVG_FT_IS_SMALL(stroker->center.x - control->x) &&
        PVG_FT_IS_SMALL(stroker->center.y - control->y) &&
        PVG_FT_IS_SMALL(control->x - to->x) &&
        PVG_FT_IS_SMALL(control->y - to->y)) {
        stroker->center = *to;
        goto Exit;
    }

    arc = bez_stack;
    arc[0] = *to;
    arc[1] = *control;
    arc[2] = stroker->center;

    while (arc >= bez_stack) {
        PVG_FT_Angle angle_in, angle_out;

        /* initialize with current direction */
        angle_in = angle_out = stroker->angle_in;

        if (arc < limit &&
            !ft_conic_is_small_enough(arc, &angle_in, &angle_out)) {
            if (stroker->first_point) stroker->angle_in = angle_in;

            ft_conic_split(arc);
            arc += 2;
            continue;
        }

        if (first_arc) {
            first_arc = FALSE;

            /* process corner if necessary */
            if (stroker->first_point)
                error = ft_stroker_subpath_start(stroker, angle_in, 0);
            else {
                stroker->angle_out = angle_in;
                error = ft_stroker_process_corner(stroker, 0);
            }
        } else if (ft_pos_abs(PVG_FT_Angle_Diff(stroker->angle_in, angle_in)) >
                   PVG_FT_SMALL_CONIC_THRESHOLD / 4) {
            /* if the deviation from one arc to the next is too great, */
            /* add a round corner                                      */
            stroker->center = arc[2];
            stroker->angle_out = angle_in;
            stroker->line_join = PVG_FT_STROKER_LINEJOIN_ROUND;

            error = ft_stroker_process_corner(stroker, 0);

            /* reinstate line join style */
            stroker->line_join = stroker->line_join_saved;
        }

        if (error) goto Exit;

        /* the arc's angle is small enough; we can add it directly to each */
        /* border                                                          */
        {
            PVG_FT_Vector       ctrl, end;
            PVG_FT_Angle        theta, phi, rotate, alpha0 = 0;
            PVG_FT_Fixed        length;
            PVG_FT_StrokeBorder border;
            PVG_FT_Int          side;

            theta = PVG_FT_Angle_Diff(angle_in, angle_out) / 2;
            phi = angle_in + theta;
            length = PVG_FT_DivFix(stroker->radius, PVG_FT_Cos(theta));

            /* compute direction of original arc */
            if (stroker->handle_wide_strokes)
                alpha0 = PVG_FT_Atan2(arc[0].x - arc[2].x, arc[0].y - arc[2].y);

            for (border = stroker->borders, side = 0; side <= 1;
                 side++, border++) {
                rotate = PVG_FT_SIDE_TO_ROTATE(side);

                /* compute control point */
                PVG_FT_Vector_From_Polar(&ctrl, length, phi + rotate);
                ctrl.x += arc[1].x;
                ctrl.y += arc[1].y;

                /* compute end point */
                PVG_FT_Vector_From_Polar(&end, stroker->radius,
                                        angle_out + rotate);
                end.x += arc[0].x;
                end.y += arc[0].y;

                if (stroker->handle_wide_strokes) {
                    PVG_FT_Vector start;
                    PVG_FT_Angle  alpha1;

                    /* determine whether the border radius is greater than the
                     */
                    /* radius of curvature of the original arc */
                    start = border->points[border->num_points - 1];

                    alpha1 = PVG_FT_Atan2(end.x - start.x, end.y - start.y);

                    /* is the direction of the border arc opposite to */
                    /* that of the original arc? */
                    if (ft_pos_abs(PVG_FT_Angle_Diff(alpha0, alpha1)) >
                        PVG_FT_ANGLE_PI / 2) {
                        PVG_FT_Angle  beta, gamma;
                        PVG_FT_Vector bvec, delta;
                        PVG_FT_Fixed  blen, sinA, sinB, alen;

                        /* use the sine rule to find the intersection point */
                        beta =
                            PVG_FT_Atan2(arc[2].x - start.x, arc[2].y - start.y);
                        gamma = PVG_FT_Atan2(arc[0].x - end.x, arc[0].y - end.y);

                        bvec.x = end.x - start.x;
                        bvec.y = end.y - start.y;

                        blen = PVG_FT_Vector_Length(&bvec);

                        sinA = ft_pos_abs(PVG_FT_Sin(alpha1 - gamma));
                        sinB = ft_pos_abs(PVG_FT_Sin(beta - gamma));

                        alen = PVG_FT_MulDiv(blen, sinA, sinB);

                        PVG_FT_Vector_From_Polar(&delta, alen, beta);
                        delta.x += start.x;
                        delta.y += start.y;

                        /* circumnavigate the negative sector backwards */
                        border->movable = FALSE;
                        error = ft_stroke_border_lineto(border, &delta, FALSE);
                        if (error) goto Exit;
                        error = ft_stroke_border_lineto(border, &end, FALSE);
                        if (error) goto Exit;
                        error = ft_stroke_border_conicto(border, &ctrl, &start);
                        if (error) goto Exit;
                        /* and then move to the endpoint */
                        error = ft_stroke_border_lineto(border, &end, FALSE);
                        if (error) goto Exit;

                        continue;
                    }

                    /* else fall through */
                }

                /* simply add an arc */
                error = ft_stroke_border_conicto(border, &ctrl, &end);
                if (error) goto Exit;
            }
        }

        arc -= 2;

        stroker->angle_in = angle_out;
    }

    stroker->center = *to;
    stroker->line_length = 0;

Exit:
    return error;
}